

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O3

void __thiscall duckdb::ColumnScanState::NextInternal(ColumnScanState *this,idx_t count)

{
  ColumnSegment *pCVar1;
  
  pCVar1 = this->current;
  if (pCVar1 != (ColumnSegment *)0x0) {
    this->row_index = this->row_index + count;
    do {
      if (this->row_index <
          (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i +
          (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).start) {
        return;
      }
      pCVar1 = (this->current->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
      this->current = pCVar1;
      this->initialized = false;
      this->segment_checked = false;
    } while (pCVar1 != (ColumnSegment *)0x0);
  }
  return;
}

Assistant:

void ColumnScanState::NextInternal(idx_t count) {
	if (!current) {
		//! There is no column segment
		return;
	}
	row_index += count;
	while (row_index >= current->start + current->count) {
		current = segment_tree->GetNextSegment(current);
		initialized = false;
		segment_checked = false;
		if (!current) {
			break;
		}
	}
	D_ASSERT(!current || (row_index >= current->start && row_index < current->start + current->count));
}